

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg4.cc
# Opt level: O0

void __thiscall trng::mrg4::mrg4(mrg4 *this,unsigned_long s,parameter_type P)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  unsigned_long in_RSI;
  mrg4 *in_RDI;
  
  *(undefined8 *)(in_RDI->P).a = in_RDX;
  *(undefined8 *)((in_RDI->P).a + 2) = in_RCX;
  mrg_status<int,_4,_trng::mrg4>::mrg_status(&in_RDI->S);
  seed(in_RDI,in_RSI);
  return;
}

Assistant:

mrg4::mrg4(unsigned long s, mrg4::parameter_type P) : P{P} { seed(s); }